

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Generic.cpp
# Opt level: O2

bool __thiscall SRUP_MSG_GENERIC::DeSerialize(SRUP_MSG_GENERIC *this,uchar *serial_data)

{
  uint8_t uVar1;
  uint64_t *puVar2;
  uint16_t uVar3;
  long lVar4;
  uint8_t (*pauVar5) [8];
  uint8_t *puVar6;
  uint8_t bytes [2];
  uint8_t snd_bytes [8];
  uint8_t sid_bytes [8];
  
  *(this->super_SRUP_MSG).m_version = *serial_data;
  *(this->super_SRUP_MSG).m_msgtype = serial_data[1];
  uVar1 = *(this->super_SRUP_MSG).m_version;
  if (uVar1 == '\x05') {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      sid_bytes[lVar4] = serial_data[lVar4 + 2];
    }
    puVar2 = (this->super_SRUP_MSG).m_sequence_ID;
    if (puVar2 != (uint64_t *)0x0) {
      operator_delete(puVar2);
    }
    pauVar5 = (uint8_t (*) [8])operator_new(8);
    (this->super_SRUP_MSG).m_sequence_ID = (uint64_t *)pauVar5;
    *pauVar5 = sid_bytes;
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      snd_bytes[lVar4] = serial_data[lVar4 + 10];
    }
    puVar2 = (this->super_SRUP_MSG).m_sender_ID;
    if (puVar2 != (uint64_t *)0x0) {
      operator_delete(puVar2);
    }
    pauVar5 = (uint8_t (*) [8])operator_new(8);
    (this->super_SRUP_MSG).m_sender_ID = (uint64_t *)pauVar5;
    *pauVar5 = snd_bytes;
    bytes = *(uint8_t (*) [2])(serial_data + 0x12);
    uVar3 = SRUP_MSG::decodeLength(bytes);
    puVar6 = (this->super_SRUP_MSG).m_token;
    if (puVar6 != (uint8_t *)0x0) {
      operator_delete__(puVar6);
    }
    puVar6 = (uint8_t *)operator_new__((ulong)uVar3);
    (this->super_SRUP_MSG).m_token = puVar6;
    memcpy(puVar6,serial_data + 0x14,(ulong)uVar3);
    (this->super_SRUP_MSG).m_token_len = uVar3;
  }
  return uVar1 == '\x05';
}

Assistant:

bool SRUP_MSG_GENERIC::DeSerialize(const unsigned char* serial_data)
{
    unsigned int p=0;
    uint16_t x;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We'll only try to extract the "generic" fields (version, type, sequence ID, sender ID, token)

    std::memcpy(m_version, serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, serial_data + p, 1);
    p+=1;

    // Given that we'll typically deserialize first into the generic message format - we need to try to validate that
    // this is a valid message ... and not some other type of data on the MQTT topic...
    // We'll try checking that the version is okay...

    if (*m_version != SRUP::SRUP_VERSION)
        return false;

    if (not (ValidMessageType (m_msgtype)))
        return false;

    // If we make it to here – there's a good chance the message is a valid one...

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t *) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete (m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // We will also unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t *) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sender_ID
    if (m_sender_ID != nullptr)
        delete (m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now the token - the last of the "generic" fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p += 2;
    delete[] m_token;
    m_token = new uint8_t[x];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;

    return true;
}